

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t1cod.c
# Opt level: O3

int JPC_ISTERMINATED(int passno,int firstpassno,int numpasses,int termall,int lazy)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = 1;
  if (passno - firstpassno != numpasses + -1) {
    iVar2 = JPC_SEGPASSCNT(passno,firstpassno,numpasses,lazy,termall);
    uVar1 = (uint)(iVar2 < 2);
  }
  return uVar1;
}

Assistant:

int JPC_ISTERMINATED(int passno, int firstpassno, int numpasses, int termall,
  int lazy)
{
	int ret;
	int n;
	if (passno - firstpassno == numpasses - 1) {
		ret = 1;
	} else {
		n = JPC_SEGPASSCNT(passno, firstpassno, numpasses, lazy, termall);
		ret = (n <= 1) ? 1 : 0;
	}

	return ret;
}